

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

void commit(ecs_world_t *world,ecs_entity_t entity,ecs_entity_info_t *info,ecs_table_t *dst_table,
           ecs_entities_t *added,ecs_entities_t *removed)

{
  int32_t iVar1;
  _Bool local_59;
  undefined8 local_58;
  int local_50;
  ecs_data_t *local_48;
  ecs_data_t *src_data;
  ecs_table_t *src_table;
  ecs_entities_t *removed_local;
  ecs_entities_t *added_local;
  ecs_table_t *dst_table_local;
  ecs_entity_info_t *info_local;
  ecs_entity_t entity_local;
  ecs_world_t *world_local;
  
  src_table = (ecs_table_t *)removed;
  removed_local = added;
  added_local = (ecs_entities_t *)dst_table;
  dst_table_local = (ecs_table_t *)info;
  info_local = (ecs_entity_info_t *)entity;
  entity_local = (ecs_entity_t)world;
  _ecs_assert((_Bool)((world->in_progress ^ 0xffU) & 1),0xc,(char *)0x0,"!world->in_progress",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x480);
  if ((*(byte *)(entity_local + 0x5c91) & 1) != 0) {
    __assert_fail("!world->in_progress",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x480,
                  "void commit(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                 );
  }
  src_data = (ecs_data_t *)dst_table_local->c_info;
  if (src_data == (ecs_data_t *)added_local) {
    if ((((removed_local != (ecs_entities_t *)0x0) && (removed_local->count != 0)) ||
        ((src_table != (ecs_table_t *)0x0 && (*(int *)&src_table->c_info != 0)))) &&
       (((ecs_table_t *)src_data != (ecs_table_t *)0x0 &&
        ((((ecs_table_t *)src_data)->flags & 0x10000) != 0)))) {
      ecs_components_switch
                ((ecs_world_t *)entity_local,(ecs_table_t *)src_data,
                 (ecs_data_t *)dst_table_local->lo_edges,*(int32_t *)&dst_table_local->hi_edges,1,
                 removed_local,(ecs_entities_t *)src_table);
    }
  }
  else {
    if ((ecs_table_t *)src_data == (ecs_table_t *)0x0) {
      if (added_local->array != (ecs_entity_t *)0x0) {
        iVar1 = new_entity((ecs_world_t *)entity_local,(ecs_entity_t)info_local,
                           (ecs_entity_info_t *)dst_table_local,(ecs_table_t *)added_local,
                           removed_local);
        *(int32_t *)&dst_table_local->hi_edges = iVar1;
        dst_table_local->c_info = (ecs_c_info_t **)added_local;
      }
    }
    else {
      local_48 = (ecs_data_t *)dst_table_local->lo_edges;
      _ecs_assert(added_local != (ecs_entities_t *)0x0,0xc,(char *)0x0,"dst_table != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x493);
      if (added_local == (ecs_entities_t *)0x0) {
        __assert_fail("dst_table != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x493,
                      "void commit(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                     );
      }
      if (added_local->array == (ecs_entity_t *)0x0) {
        delete_entity((ecs_world_t *)entity_local,(ecs_table_t *)src_data,local_48,
                      *(int32_t *)&dst_table_local->hi_edges,(ecs_entities_t *)src_table);
        local_58 = 0;
        local_50 = -(uint)(((ulong)dst_table_local->hi_edges & 0x100000000) == 0x100000000);
        _ecs_sparse_set(*(ecs_sparse_t **)(entity_local + 0x4828),0x10,(uint64_t)info_local,
                        &local_58);
      }
      else {
        iVar1 = move_entity((ecs_world_t *)entity_local,(ecs_entity_t)info_local,
                            (ecs_entity_info_t *)dst_table_local,(ecs_table_t *)src_data,local_48,
                            *(int32_t *)&dst_table_local->hi_edges,(ecs_table_t *)added_local,
                            removed_local,(ecs_entities_t *)src_table);
        *(int32_t *)&dst_table_local->hi_edges = iVar1;
        dst_table_local->c_info = (ecs_c_info_t **)added_local;
      }
    }
    if (((ulong)dst_table_local->hi_edges & 0x100000000) != 0) {
      update_component_monitors
                ((ecs_world_t *)entity_local,(ecs_entity_t)info_local,removed_local,
                 (ecs_entities_t *)src_table);
    }
    if (((src_data == (ecs_data_t *)0x0) || (src_data->entities == (ecs_vector_t *)0x0)) &&
       ((*(byte *)(entity_local + 0x4820) & 1) != 0)) {
      local_59 = true;
      if (*(long *)(entity_local + 0x5c10) != 0) {
        local_59 = info_local <= *(ecs_entity_info_t **)(entity_local + 0x5c10);
      }
      _ecs_assert(local_59,0x1c,(char *)0x0,"!world->stats.max_id || entity <= world->stats.max_id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x4b3);
      if ((*(long *)(entity_local + 0x5c10) != 0) &&
         (*(ecs_entity_info_t **)(entity_local + 0x5c10) < info_local)) {
        __assert_fail("!world->stats.max_id || entity <= world->stats.max_id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x4b3,
                      "void commit(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                     );
      }
      _ecs_assert(*(ecs_entity_info_t **)(entity_local + 0x5c08) <= info_local,0x1c,(char *)0x0,
                  "entity >= world->stats.min_id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x4b4);
      if (info_local < *(ecs_entity_info_t **)(entity_local + 0x5c08)) {
        __assert_fail("entity >= world->stats.min_id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x4b4,
                      "void commit(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                     );
      }
    }
  }
  return;
}

Assistant:

static
void commit(
    ecs_world_t * world,
    ecs_entity_t entity,
    ecs_entity_info_t * info,
    ecs_table_t * dst_table,   
    ecs_entities_t * added,
    ecs_entities_t * removed)
{
    ecs_assert(!world->in_progress, ECS_INTERNAL_ERROR, NULL);
    
    ecs_table_t *src_table = info->table;
    if (src_table == dst_table) {
        /* If source and destination table are the same no action is needed *
         * However, if a component was added in the process of traversing a
         * table, this suggests that a case switch could have occured. */
        if (((added && added->count) || (removed && removed->count)) && 
             src_table && src_table->flags & EcsTableHasSwitch) 
        {
            ecs_components_switch(
                world, src_table, info->data, info->row, 1, added, removed);
        }

        return;
    }  

    if (src_table) {
        ecs_data_t *src_data = info->data;
        ecs_assert(dst_table != NULL, ECS_INTERNAL_ERROR, NULL);

        if (dst_table->type) { 
            info->row = move_entity(world, entity, info, src_table, 
                src_data, info->row, dst_table, added, removed);
            info->table = dst_table;
        } else {
            delete_entity(
                world, src_table, src_data, info->row, 
                removed);

            ecs_eis_set(world, entity, &(ecs_record_t){
                NULL, (info->is_watched == true) * -1
            });
        }      
    } else {        
        if (dst_table->type) {
            info->row = new_entity(world, entity, info, dst_table, added);
            info->table = dst_table;
        }        
    }

    /* If the entity is being watched, it is being monitored for changes and
    * requires rematching systems when components are added or removed. This
    * ensures that systems that rely on components from containers or prefabs
    * update the matched tables when the application adds or removes a 
    * component from, for example, a container. */
    if (info->is_watched) {
        update_component_monitors(world, entity, added, removed);
    }

    if ((!src_table || !src_table->type) && world->range_check_enabled) {
        ecs_assert(!world->stats.max_id || entity <= world->stats.max_id, ECS_OUT_OF_RANGE, 0);
        ecs_assert(entity >= world->stats.min_id, ECS_OUT_OF_RANGE, 0);
    } 
}